

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene_bsp.cpp
# Opt level: O2

QString * __thiscall
QGraphicsSceneBspTree::debug(QString *__return_storage_ptr__,QGraphicsSceneBspTree *this,int index)

{
  Type TVar1;
  storage_type *psVar2;
  Node *pNVar3;
  QRectF *this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  undefined1 auStack_e8 [48];
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QRectF local_58;
  long local_38;
  
  this_00 = (QRectF *)auStack_e8;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar3 = (this->nodes).d.ptr;
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  TVar1 = pNVar3[index].type;
  if ((TVar1 == Horizontal) || (TVar1 != Leaf)) {
    debug((QString *)&local_58,this,index * 2 + 1);
    QString::append((QString *)__return_storage_ptr__);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    this_00 = &local_58;
    debug((QString *)this_00,this,index * 2 + 2);
    QString::append((QString *)__return_storage_ptr__);
  }
  else {
    pNVar3 = pNVar3 + index;
    local_58.w._0_4_ = 0xffffffff;
    local_58.w._4_4_ = 0xffffffff;
    local_58.h._0_4_ = 0xffffffff;
    local_58.h._4_4_ = 0xffffffff;
    local_58.xp._0_4_ = 0xffffffff;
    local_58.xp._4_4_ = 0xffffffff;
    local_58.yp._0_4_ = 0xffffffff;
    local_58.yp._4_4_ = 0xffffffff;
    rectForIndex(&local_58,this,index);
    if ((this->leaves).d.ptr[(pNVar3->field_0).leafIndex].d.size == 0) goto LAB_005b0dbd;
    psVar2 = (storage_type *)
             QByteArrayView::lengthHelperCharArray("[%1, %2, %3, %4] contains %5 items\n",0x24);
    QVar4.m_data = psVar2;
    QVar4.m_size = (qsizetype)auStack_e8;
    QString::fromLatin1(QVar4);
    QString::arg_impl((double)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_),(int)auStack_e8 + 0x18,
                      (char)auStack_e8,0,(QChar)0x67);
    QString::arg_impl((double)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_),(int)&local_b8,
                      (char)auStack_e8 + '\x18',0,(QChar)0x67);
    QString::arg_impl((double)CONCAT44(local_58.w._4_4_,local_58.w._0_4_),(int)&local_a0,
                      (char)&local_b8,0,(QChar)0x67);
    QString::arg_impl((double)CONCAT44(local_58.h._4_4_,local_58.h._0_4_),(int)&local_88,
                      (char)&local_a0,0,(QChar)0x67);
    QString::arg_impl((longlong)&local_70,(int)&local_88,
                      (int)(this->leaves).d.ptr[(pNVar3->field_0).leafIndex].d.size,(QChar)0x0);
    QString::append((QString *)__return_storage_ptr__);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)(auStack_e8 + 0x18));
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_00);
LAB_005b0dbd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QGraphicsSceneBspTree::debug(int index) const
{
    const Node *node = &nodes.at(index);

    QString tmp;
    if (node->type == Node::Leaf) {
        QRectF rect = rectForIndex(index);
        if (!leaves[node->leafIndex].isEmpty()) {
            tmp += QString::fromLatin1("[%1, %2, %3, %4] contains %5 items\n")
                   .arg(rect.left()).arg(rect.top())
                   .arg(rect.width()).arg(rect.height())
                   .arg(leaves[node->leafIndex].size());
        }
    } else {
        if (node->type == Node::Horizontal) {
            tmp += debug(firstChildIndex(index));
            tmp += debug(firstChildIndex(index) + 1);
        } else {
            tmp += debug(firstChildIndex(index));
            tmp += debug(firstChildIndex(index) + 1);
        }
    }

    return tmp;
}